

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_CLASS::Save
          (_Type_CLASS *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Class *this_00;
  pointer pVVar1;
  pointer pVVar2;
  uint uVar3;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *pvVar4;
  Object *pOVar5;
  char *pcVar6;
  ostream *poVar7;
  array<LiteScript::Nullable<LiteScript::Variable>,_33UL> *paVar8;
  uint uVar9;
  ulong uVar10;
  long in_R8;
  long lVar11;
  code *pcVar12;
  long *plVar13;
  
  this_00 = (Class *)object->data;
  pvVar4 = Class::GetInherits(this_00);
  OStreamer::Write<unsigned_int>
            (stream,(uint)((ulong)((long)(pvVar4->
                                         super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar4->
                                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 4));
  pVVar1 = (pvVar4->super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = (pvVar4->super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar10 = 0; ((long)pVVar1 - (long)pVVar2 & 0xffffffff0U) != uVar10; uVar10 = uVar10 + 0x10) {
    plVar13 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar12 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar12 = *(code **)(*plVar13 + -1 + caller);
    }
    pOVar5 = Variable::operator->
                       ((Variable *)
                        ((long)&((pvVar4->
                                 super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->obj + uVar10));
    (*pcVar12)(plVar13,stream,pOVar5->ID);
  }
  uVar3 = Class::GetStaticCount(this_00);
  OStreamer::Write<unsigned_int>(stream,uVar3);
  uVar3 = Class::GetStaticCount(this_00);
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    pcVar6 = Class::GetStaticName(this_00,uVar9);
    poVar7 = std::operator<<(stream,pcVar6);
    std::operator<<(poVar7,'\0');
    plVar13 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar12 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar12 = *(code **)(*plVar13 + -1 + caller);
    }
    Class::GetStaticMember((Class *)&stack0xffffffffffffffc0,(uint)this_00);
    pOVar5 = Variable::operator->((Variable *)&stack0xffffffffffffffc0);
    (*pcVar12)(plVar13,stream,pOVar5->ID);
    Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
  }
  uVar3 = Class::GetUnstaticCount(this_00);
  OStreamer::Write<unsigned_int>(stream,uVar3);
  uVar3 = Class::GetUnstaticCount(this_00);
  for (uVar9 = 0; uVar3 != uVar9; uVar9 = uVar9 + 1) {
    pcVar6 = Class::GetUnstaticName(this_00,uVar9);
    poVar7 = std::operator<<(stream,pcVar6);
    std::operator<<(poVar7,'\0');
    plVar13 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar12 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar12 = *(code **)(*plVar13 + -1 + caller);
    }
    Class::GetUnstaticMember((Class *)&stack0xffffffffffffffc0,(uint)this_00);
    pOVar5 = Variable::operator->((Variable *)&stack0xffffffffffffffc0);
    (*pcVar12)(plVar13,stream,pOVar5->ID);
    Variable::~Variable((Variable *)&stack0xffffffffffffffc0);
  }
  uVar3 = Class::GetConstructorIndex(this_00);
  OStreamer::Write<unsigned_int>(stream,uVar3);
  paVar8 = Class::GetOperators(this_00);
  for (lVar11 = 0; lVar11 != 0x420; lVar11 = lVar11 + 0x20) {
    if (**(char **)(paVar8->_M_elems[0].data + lVar11 + 0x18) == '\x01') {
      std::operator<<(stream,'\0');
    }
    else {
      std::operator<<(stream,'\x01');
      plVar13 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
      pcVar12 = (code *)caller;
      if ((caller & 1) != 0) {
        pcVar12 = *(code **)(*plVar13 + -1 + caller);
      }
      pOVar5 = Variable::operator->((Variable *)(paVar8->_M_elems[0].data + lVar11));
      (*pcVar12)(plVar13,stream,pOVar5->ID);
    }
  }
  return;
}

Assistant:

void LiteScript::_Type_CLASS::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Class& C = object.GetData<Class>();
    const std::vector<LiteScript::Variable>& inherits = C.GetInherits();
    OStreamer::Write<unsigned int>(stream, inherits.size());
    for (unsigned int i = 0, sz = inherits.size(); i < sz; i++)
        (object.memory.*caller)(stream, inherits[i]->ID);
    OStreamer::Write<unsigned int>(stream, C.GetStaticCount());
    for (unsigned int i = 0, sz = C.GetStaticCount(); i < sz; i++) {
        stream << C.GetStaticName(i) << (uint8_t)0;
        (object.memory.*caller)(stream, C.GetStaticMember(i)->ID);
    }
    OStreamer::Write<unsigned int>(stream, C.GetUnstaticCount());
    for (unsigned int i = 0, sz = C.GetUnstaticCount(); i < sz; i++) {
        stream << C.GetUnstaticName(i) << (uint8_t)0;
        (object.memory.*caller)(stream, C.GetUnstaticMember(i)->ID);
    }
    OStreamer::Write<int>(stream, C.GetConstructorIndex());
    const std::array<Nullable<Variable>, Class::OperatorType::OP_TYPE_NUMBER>& op_list = C.GetOperators();
    for (unsigned int i = 0; i < Class::OperatorType::OP_TYPE_NUMBER; i++) {
        if (op_list[i].isNull)
            stream << (uint8_t)0;
        else {
            stream << (uint8_t)1;
            (object.memory.*caller)(stream, (*op_list[i])->ID);
        }
    }
}